

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O0

void expels(monst *mtmp,permonst *mdat,boolean message)

{
  uchar uVar1;
  boolean bVar2;
  char *pcVar3;
  int local_4c;
  char local_48 [4];
  int i;
  char blast [40];
  boolean message_local;
  permonst *mdat_local;
  monst *mtmp_local;
  
  blast[0x27] = message;
  if (message != '\0') {
    if ((mdat->mflags1 & 0x40000) == 0) {
      local_48[0] = '\0';
      local_4c = 0;
      while ((local_4c < 6 && (mdat->mattk[local_4c].aatyp != '\v'))) {
        local_4c = local_4c + 1;
      }
      if ((local_4c < 6) && (mdat->mattk[local_4c].aatyp != '\v')) {
        warning("Swallower has no engulfing attack?");
      }
      else {
        if ((mdat->mlet == '\x16') || (mdat == mons + 0x9f)) {
          uVar1 = mdat->mattk[local_4c].adtyp;
          if (uVar1 == '\x03') {
            strcpy(local_48," in a blast of frost");
          }
          else if (uVar1 == '\x06') {
            strcpy(local_48," in a shower of sparks");
          }
        }
        else {
          strcpy(local_48," with a squelch");
        }
        pcVar3 = mon_nam(mtmp);
        pline("You get expelled from %s%s!",pcVar3,local_48);
      }
    }
    else {
      pline("You get regurgitated!");
    }
  }
  unstuck(mtmp);
  mnexto(mtmp);
  newsym((int)u.ux,(int)u.uy);
  spoteffects('\x01');
  bVar2 = um_dist(mtmp->mx,mtmp->my,'\x01');
  if (bVar2 != '\0') {
    pline("Brrooaa...  You land hard at some distance.");
  }
  return;
}

Assistant:

void expels(struct monst *mtmp,
	    const struct permonst *mdat, /* if mtmp is polymorphed, mdat != mtmp->data */
	    boolean message)
{
	if (message) {
		if (is_animal(mdat))
			pline("You get regurgitated!");
		else {
			char blast[40];
			int i;

			blast[0] = '\0';
			for (i = 0; i < NATTK; i++)
				if (mdat->mattk[i].aatyp == AT_ENGL)
					break;
			if (i < NATTK && mdat->mattk[i].aatyp != AT_ENGL) {
			      warning("Swallower has no engulfing attack?");
			} else {
				if (is_whirly(mdat)) {
					switch (mdat->mattk[i].adtyp) {
						case AD_ELEC:
							strcpy(blast,
						      " in a shower of sparks");
							break;
						case AD_COLD:
							strcpy(blast,
							" in a blast of frost");
							break;
					}
				} else
					strcpy(blast, " with a squelch");
				pline("You get expelled from %s%s!",
				    mon_nam(mtmp), blast);
			}
		}
	}
	unstuck(mtmp);	/* ball&chain returned in unstuck() */
	mnexto(mtmp);
	newsym(u.ux,u.uy);
	spoteffects(TRUE);
	/* to cover for a case where mtmp is not in a next square */
	if (um_dist(mtmp->mx,mtmp->my,1))
		pline("Brrooaa...  You land hard at some distance.");
}